

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Button.cxx
# Opt level: O0

Fl_Menu_Item * __thiscall Fl_Menu_Button::popup(Fl_Menu_Button *this)

{
  Fl_Widget_Tracker FVar1;
  uchar uVar2;
  Fl_Boxtype FVar3;
  int iVar4;
  int iVar5;
  int W;
  int H;
  Fl_Menu_Item *pFVar6;
  char *title;
  Fl_Menu_Item *picked;
  Fl_Widget_Tracker local_20;
  Fl_Widget_Tracker mb;
  Fl_Menu_Item *m;
  Fl_Menu_Button *this_local;
  
  pressed_menu_button_ = this;
  Fl_Widget::redraw((Fl_Widget *)this);
  Fl_Widget_Tracker::Fl_Widget_Tracker(&local_20,(Fl_Widget *)this);
  FVar3 = Fl_Widget::box((Fl_Widget *)this);
  if (FVar3 != FL_NO_BOX) {
    uVar2 = Fl_Widget::type((Fl_Widget *)this);
    if (uVar2 == '\0') {
      pFVar6 = Fl_Menu_::menu(&this->super_Fl_Menu_);
      iVar4 = Fl_Widget::x((Fl_Widget *)this);
      iVar5 = Fl_Widget::y((Fl_Widget *)this);
      W = Fl_Widget::w((Fl_Widget *)this);
      H = Fl_Widget::h((Fl_Widget *)this);
      mb.wp_ = (Fl_Widget *)
               Fl_Menu_Item::pulldown
                         (pFVar6,iVar4,iVar5,W,H,(Fl_Menu_Item *)0x0,&this->super_Fl_Menu_,
                          (Fl_Menu_Item *)0x0,0);
      goto LAB_00202281;
    }
  }
  pFVar6 = Fl_Menu_::menu(&this->super_Fl_Menu_);
  iVar4 = Fl::event_x();
  iVar5 = Fl::event_y();
  title = Fl_Widget::label((Fl_Widget *)this);
  picked = Fl_Menu_::mvalue(&this->super_Fl_Menu_);
  mb.wp_ = (Fl_Widget *)Fl_Menu_Item::popup(pFVar6,iVar4,iVar5,title,picked,&this->super_Fl_Menu_);
LAB_00202281:
  Fl_Menu_::picked(&this->super_Fl_Menu_,(Fl_Menu_Item *)mb.wp_);
  pressed_menu_button_ = (Fl_Menu_Button *)0x0;
  iVar4 = Fl_Widget_Tracker::exists(&local_20);
  if (iVar4 != 0) {
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  FVar1.wp_ = mb.wp_;
  Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_20);
  return (Fl_Menu_Item *)FVar1.wp_;
}

Assistant:

const Fl_Menu_Item* Fl_Menu_Button::popup() {
  const Fl_Menu_Item* m;
  pressed_menu_button_ = this;
  redraw();
  Fl_Widget_Tracker mb(this);
  if (!box() || type()) {
    m = menu()->popup(Fl::event_x(), Fl::event_y(), label(), mvalue(), this);
  } else {
    m = menu()->pulldown(x(), y(), w(), h(), 0, this);
  }
  picked(m);
  pressed_menu_button_ = 0;
  if (mb.exists()) redraw();
  return m;
}